

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::AssertionResult::getExpandedExpression_abi_cxx11_
          (string *__return_storage_ptr__,AssertionResult *this)

{
  ulong uVar1;
  undefined1 local_38 [8];
  string expr;
  AssertionResult *this_local;
  
  expr.field_2._8_8_ = this;
  AssertionResultData::reconstructExpression_abi_cxx11_((string *)local_38,&this->m_resultData);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_38);
  }
  else {
    getExpression_abi_cxx11_(__return_storage_ptr__,this);
  }
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string AssertionResult::getExpandedExpression() const {
        std::string expr = m_resultData.reconstructExpression();
        return expr.empty()
                ? getExpression()
                : expr;
    }